

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CuTest.c
# Opt level: O3

void CuTestRun(CuTest *tc)

{
  int iVar1;
  jmp_buf buf;
  __jmp_buf_tag _Stack_d8;
  
  tc->jumpBuf = (jmp_buf *)&_Stack_d8;
  iVar1 = _setjmp((__jmp_buf_tag *)&_Stack_d8);
  if (iVar1 == 0) {
    tc->ran = 1;
    (*tc->function)(tc);
  }
  tc->jumpBuf = (jmp_buf *)0x0;
  return;
}

Assistant:

void CuTestRun(CuTest* tc)
{
	jmp_buf buf;
	tc->jumpBuf = &buf;
	if (setjmp(buf) == 0)
	{
		tc->ran = 1;
		(tc->function)(tc);
	}
	tc->jumpBuf = 0;
}